

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.hpp
# Opt level: O2

void __thiscall
diy::stats::ScopedProfile<diy::stats::Profiler>::~ScopedProfile
          (ScopedProfile<diy::stats::Profiler> *this)

{
  Profiler *this_00;
  string local_30;
  
  if (this->active == true) {
    this_00 = this->prof;
    std::__cxx11::string::string((string *)&local_30,(string *)&this->name);
    Profiler::operator>>(this_00,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

~ScopedProfile()                            { if (active) prof >> name; }